

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<int,_int>_>::reallocateAndGrow
          (QArrayDataPointer<std::pair<int,_int>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<std::pair<int,_int>_> *old)

{
  long lVar1;
  bool bVar2;
  pair<int,_int> *ppVar3;
  QPodArrayOps<std::pair<int,_int>_> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<std::pair<int,_int>_> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<std::pair<int,_int>_> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<std::pair<int,_int>_> *in_stack_ffffffffffffff70;
  QArrayDataPointer<std::pair<int,_int>_> *in_stack_ffffffffffffff78;
  QArrayDataPointer<std::pair<int,_int>_> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<std::pair<int,_int>_> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,
                 in_ESI);
    if ((0 < in_RDX) &&
       (ppVar3 = data((QArrayDataPointer<std::pair<int,_int>_> *)&stack0xffffffffffffffe0),
       ppVar3 == (pair<int,_int> *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_008a1b54;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<std::pair<int,_int>_> *)
                  operator->((QArrayDataPointer<std::pair<int,_int>_> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<std::pair<int,_int>_> *)0x8a1a67);
        begin((QArrayDataPointer<std::pair<int,_int>_> *)0x8a1a76);
        QtPrivate::QPodArrayOps<std::pair<int,_int>_>::copyAppend
                  (this_00,(pair<int,_int> *)in_stack_ffffffffffffff78,
                   (pair<int,_int> *)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<std::pair<int,_int>_> *)
             operator->((QArrayDataPointer<std::pair<int,_int>_> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<std::pair<int,_int>_> *)0x8a1aaf);
        begin((QArrayDataPointer<std::pair<int,_int>_> *)0x8a1abe);
        QtPrivate::QPodArrayOps<std::pair<int,_int>_>::moveAppend
                  ((QPodArrayOps<std::pair<int,_int>_> *)in_stack_ffffffffffffff70,
                   (pair<int,_int> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (pair<int,_int> *)0x8a1adc);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<std::pair<int,_int>_> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<std::pair<int,_int>_> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<std::pair<int,_int>_>::reallocate
              ((QPodArrayOps<std::pair<int,_int>_> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_008a1b54:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }